

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

int __thiscall IndexTree::balance(IndexTree *this,int32_t *root)

{
  int iVar1;
  Node *pNVar2;
  int32_t *in_RSI;
  IndexTree *in_RDI;
  Node *_root;
  int height_change;
  int local_14;
  
  local_14 = 0;
  pNVar2 = in_RDI->nodes;
  iVar1 = *in_RSI;
  if (pNVar2[iVar1].balance_factor < -1) {
    if (in_RDI->nodes[pNVar2[iVar1].left].balance_factor == 1) {
      local_14 = rotateTwice(in_RDI,in_RSI,-1);
    }
    else {
      local_14 = rotateOnce(in_RDI,in_RSI,1);
    }
  }
  else if (1 < pNVar2[iVar1].balance_factor) {
    if (in_RDI->nodes[pNVar2[iVar1].right].balance_factor == -1) {
      local_14 = rotateTwice(in_RDI,in_RSI,1);
    }
    else {
      local_14 = rotateOnce(in_RDI,in_RSI,-1);
    }
  }
  return local_14;
}

Assistant:

int IndexTree::balance(int32_t &root) {
    int height_change = 0;
    auto &_root = nodes[root];
    if (_root.balance_factor < -1) {
        // left unbalanced, need right rotation
        if (nodes[_root.left].balance_factor == 1) {
            // LR rotation
            height_change = rotateTwice(root, -1);
        } else {
            // R rotation
            height_change = rotateOnce(root, 1);
        }
    } else if (_root.balance_factor > 1) {
        // right unbalanced, need left rotation
        if (nodes[_root.right].balance_factor == -1) {
            // RL rotation
            height_change = rotateTwice(root, 1);
        } else {
            // L rotation
            height_change = rotateOnce(root, -1);
        }
    }

    return height_change;
}